

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

void fsg_model_write(fsg_model_t *fsg,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  fsg_link_t *pfVar3;
  float64 fVar4;
  char *local_68;
  char *local_60;
  char *local_40;
  fsg_link_t *tl;
  fsg_arciter_t *itor;
  int32 i;
  FILE *fp_local;
  fsg_model_t *fsg_local;
  
  if (fsg->name == (char *)0x0) {
    local_40 = "";
  }
  else {
    local_40 = fsg->name;
  }
  fprintf((FILE *)fp,"%s %s\n","FSG_BEGIN",local_40);
  fprintf((FILE *)fp,"%s %d\n","NUM_STATES",(ulong)(uint)fsg->n_state);
  fprintf((FILE *)fp,"%s %d\n","START_STATE",(ulong)(uint)fsg->start_state);
  fprintf((FILE *)fp,"%s %d\n","FINAL_STATE",(ulong)(uint)fsg->final_state);
  for (itor._4_4_ = 0; itor._4_4_ < fsg->n_state; itor._4_4_ = itor._4_4_ + 1) {
    for (tl = (fsg_link_t *)fsg_model_arcs(fsg,itor._4_4_); tl != (fsg_link_t *)0x0;
        tl = (fsg_link_t *)fsg_arciter_next((fsg_arciter_t *)tl)) {
      pfVar3 = fsg_arciter_get((fsg_arciter_t *)tl);
      uVar1 = pfVar3->from_state;
      uVar2 = pfVar3->to_state;
      fVar4 = logmath_exp(fsg->lmath,(int)((float)pfVar3->logs2prob / (float)fsg->lw));
      if (pfVar3->wid < 0) {
        local_60 = "";
      }
      else {
        if (pfVar3->wid == -1) {
          local_68 = "(NULL)";
        }
        else {
          local_68 = fsg->vocab[pfVar3->wid];
        }
        local_60 = local_68;
      }
      fprintf((FILE *)fp,"%s %d %d %f %s\n",fVar4,"TRANSITION",(ulong)uVar1,(ulong)uVar2,local_60);
    }
  }
  fprintf((FILE *)fp,"%s\n","FSG_END");
  fflush((FILE *)fp);
  return;
}

Assistant:

void
fsg_model_write(fsg_model_t * fsg, FILE * fp)
{
    int32 i;

    fprintf(fp, "%s %s\n", FSG_MODEL_BEGIN_DECL,
            fsg->name ? fsg->name : "");
    fprintf(fp, "%s %d\n", FSG_MODEL_NUM_STATES_DECL, fsg->n_state);
    fprintf(fp, "%s %d\n", FSG_MODEL_START_STATE_DECL, fsg->start_state);
    fprintf(fp, "%s %d\n", FSG_MODEL_FINAL_STATE_DECL, fsg->final_state);

    for (i = 0; i < fsg->n_state; i++) {
        fsg_arciter_t *itor;

        for (itor = fsg_model_arcs(fsg, i); itor;
             itor = fsg_arciter_next(itor)) {
            fsg_link_t *tl = fsg_arciter_get(itor);

            fprintf(fp, "%s %d %d %f %s\n", FSG_MODEL_TRANSITION_DECL,
                    tl->from_state, tl->to_state,
                    logmath_exp(fsg->lmath,
                                (int32) (tl->logs2prob / fsg->lw)),
                    (tl->wid < 0) ? "" : fsg_model_word_str(fsg, tl->wid));
        }
    }

    fprintf(fp, "%s\n", FSG_MODEL_END_DECL);

    fflush(fp);
}